

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::DCT_Upsample::R_S<5,_5>::calc(Matrix44 *R,Matrix44 *S,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  Element_Type *pEVar22;
  Temp_Type X137;
  Temp_Type X136;
  Temp_Type X135;
  Temp_Type X134;
  Temp_Type X133;
  Temp_Type X132;
  Temp_Type X131;
  Temp_Type X130;
  Temp_Type X127;
  Temp_Type X126;
  Temp_Type X125;
  Temp_Type X124;
  Temp_Type X123;
  Temp_Type X122;
  Temp_Type X121;
  Temp_Type X120;
  Temp_Type X117;
  Temp_Type X116;
  Temp_Type X115;
  Temp_Type X114;
  Temp_Type X113;
  Temp_Type X112;
  Temp_Type X111;
  Temp_Type X110;
  Temp_Type X107;
  Temp_Type X106;
  Temp_Type X105;
  Temp_Type X104;
  Temp_Type X103;
  Temp_Type X102;
  Temp_Type X101;
  Temp_Type X100;
  jpgd_block_t *pSrc_local;
  Matrix44 *S_local;
  Matrix44 *R_local;
  
  sVar1 = pSrc[1];
  sVar2 = pSrc[3];
  iVar16 = pSrc[9] * 0x3a0 + pSrc[0xb] * -0x145 + 0x200 >> 10;
  sVar3 = pSrc[0x11];
  sVar4 = pSrc[0x13];
  iVar17 = pSrc[0x19] * 0x3a0 + pSrc[0x1b] * -0x145 + 0x200 >> 10;
  sVar5 = pSrc[0x21];
  sVar6 = pSrc[0x23];
  sVar7 = pSrc[2];
  iVar18 = (int)pSrc[10];
  sVar8 = pSrc[0x12];
  iVar19 = (int)pSrc[0x1a];
  sVar9 = pSrc[0x22];
  sVar10 = pSrc[1];
  sVar11 = pSrc[3];
  iVar20 = pSrc[9] * -0x4b + pSrc[0xb] * 0x20e + 0x200 >> 10;
  sVar12 = pSrc[0x11];
  sVar13 = pSrc[0x13];
  iVar21 = pSrc[0x19] * -0x4b + pSrc[0x1b] * 0x20e + 0x200 >> 10;
  sVar14 = pSrc[0x21];
  sVar15 = pSrc[0x23];
  pEVar22 = Matrix44::at(R,0,0);
  *pEVar22 = sVar1 * 0x3a0 + sVar2 * -0x145 + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,0,1);
  *pEVar22 = iVar16 * 0x1aa + iVar17 * 0x32a + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,0,2);
  *pEVar22 = sVar5 * 0x3a0 + sVar6 * -0x145 + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,0,3);
  *pEVar22 = iVar16 * 0x17 + iVar17 * -99 + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,1,0);
  *pEVar22 = (int)sVar7;
  pEVar22 = Matrix44::at(R,1,1);
  *pEVar22 = iVar18 * 0x1aa + iVar19 * 0x32a + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,1,2);
  *pEVar22 = (int)sVar9;
  pEVar22 = Matrix44::at(R,1,3);
  *pEVar22 = iVar18 * 0x17 + iVar19 * -99 + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,2,0);
  *pEVar22 = sVar10 * -0x4b + sVar11 * 0x20e + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,2,1);
  *pEVar22 = iVar20 * 0x1aa + iVar21 * 0x32a + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,2,2);
  *pEVar22 = sVar14 * -0x4b + sVar15 * 0x20e + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,2,3);
  *pEVar22 = iVar20 * 0x17 + iVar21 * -99 + 0x200 >> 10;
  pEVar22 = Matrix44::at(R,3,0);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(R,3,1);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(R,3,2);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(R,3,3);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(S,0,0);
  *pEVar22 = iVar16 * 0x3a0 + iVar17 * -0x145 + 0x200 >> 10;
  pEVar22 = Matrix44::at(S,0,1);
  *pEVar22 = sVar3 * 0x3a0 + sVar4 * -0x145 + 0x200 >> 10;
  pEVar22 = Matrix44::at(S,0,2);
  *pEVar22 = iVar16 * -0x4b + iVar17 * 0x20e + 0x200 >> 10;
  pEVar22 = Matrix44::at(S,0,3);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(S,1,0);
  *pEVar22 = iVar18 * 0x3a0 + iVar19 * -0x145 + 0x200 >> 10;
  pEVar22 = Matrix44::at(S,1,1);
  *pEVar22 = (int)sVar8;
  pEVar22 = Matrix44::at(S,1,2);
  *pEVar22 = iVar18 * -0x4b + iVar19 * 0x20e + 0x200 >> 10;
  pEVar22 = Matrix44::at(S,1,3);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(S,2,0);
  *pEVar22 = iVar20 * 0x3a0 + iVar21 * -0x145 + 0x200 >> 10;
  pEVar22 = Matrix44::at(S,2,1);
  *pEVar22 = sVar12 * -0x4b + sVar13 * 0x20e + 0x200 >> 10;
  pEVar22 = Matrix44::at(S,2,2);
  *pEVar22 = iVar20 * -0x4b + iVar21 * 0x20e + 0x200 >> 10;
  pEVar22 = Matrix44::at(S,2,3);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(S,3,0);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(S,3,1);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(S,3,2);
  *pEVar22 = 0;
  pEVar22 = Matrix44::at(S,3,3);
  *pEVar22 = 0;
  return;
}

Assistant:

static void calc(Matrix44& R, Matrix44& S, const jpgd_block_t* pSrc)
    {
      // 4x8 = 4x8 times 8x8, matrix 0 is constant
      const Temp_Type X100 = D(F(0.906127f) * AT(1, 0) + F(-0.318190f) * AT(3, 0) + F(0.212608f) * AT(5, 0) + F(-0.180240f) * AT(7, 0));
      const Temp_Type X101 = D(F(0.906127f) * AT(1, 1) + F(-0.318190f) * AT(3, 1) + F(0.212608f) * AT(5, 1) + F(-0.180240f) * AT(7, 1));
      const Temp_Type X102 = D(F(0.906127f) * AT(1, 2) + F(-0.318190f) * AT(3, 2) + F(0.212608f) * AT(5, 2) + F(-0.180240f) * AT(7, 2));
      const Temp_Type X103 = D(F(0.906127f) * AT(1, 3) + F(-0.318190f) * AT(3, 3) + F(0.212608f) * AT(5, 3) + F(-0.180240f) * AT(7, 3));
      const Temp_Type X104 = D(F(0.906127f) * AT(1, 4) + F(-0.318190f) * AT(3, 4) + F(0.212608f) * AT(5, 4) + F(-0.180240f) * AT(7, 4));
      const Temp_Type X105 = D(F(0.906127f) * AT(1, 5) + F(-0.318190f) * AT(3, 5) + F(0.212608f) * AT(5, 5) + F(-0.180240f) * AT(7, 5));
      const Temp_Type X106 = D(F(0.906127f) * AT(1, 6) + F(-0.318190f) * AT(3, 6) + F(0.212608f) * AT(5, 6) + F(-0.180240f) * AT(7, 6));
      const Temp_Type X107 = D(F(0.906127f) * AT(1, 7) + F(-0.318190f) * AT(3, 7) + F(0.212608f) * AT(5, 7) + F(-0.180240f) * AT(7, 7));
      const Temp_Type X110 = AT(2, 0);
      const Temp_Type X111 = AT(2, 1);
      const Temp_Type X112 = AT(2, 2);
      const Temp_Type X113 = AT(2, 3);
      const Temp_Type X114 = AT(2, 4);
      const Temp_Type X115 = AT(2, 5);
      const Temp_Type X116 = AT(2, 6);
      const Temp_Type X117 = AT(2, 7);
      const Temp_Type X120 = D(F(-0.074658f) * AT(1, 0) + F(0.513280f) * AT(3, 0) + F(0.768178f) * AT(5, 0) + F(-0.375330f) * AT(7, 0));
      const Temp_Type X121 = D(F(-0.074658f) * AT(1, 1) + F(0.513280f) * AT(3, 1) + F(0.768178f) * AT(5, 1) + F(-0.375330f) * AT(7, 1));
      const Temp_Type X122 = D(F(-0.074658f) * AT(1, 2) + F(0.513280f) * AT(3, 2) + F(0.768178f) * AT(5, 2) + F(-0.375330f) * AT(7, 2));
      const Temp_Type X123 = D(F(-0.074658f) * AT(1, 3) + F(0.513280f) * AT(3, 3) + F(0.768178f) * AT(5, 3) + F(-0.375330f) * AT(7, 3));
      const Temp_Type X124 = D(F(-0.074658f) * AT(1, 4) + F(0.513280f) * AT(3, 4) + F(0.768178f) * AT(5, 4) + F(-0.375330f) * AT(7, 4));
      const Temp_Type X125 = D(F(-0.074658f) * AT(1, 5) + F(0.513280f) * AT(3, 5) + F(0.768178f) * AT(5, 5) + F(-0.375330f) * AT(7, 5));
      const Temp_Type X126 = D(F(-0.074658f) * AT(1, 6) + F(0.513280f) * AT(3, 6) + F(0.768178f) * AT(5, 6) + F(-0.375330f) * AT(7, 6));
      const Temp_Type X127 = D(F(-0.074658f) * AT(1, 7) + F(0.513280f) * AT(3, 7) + F(0.768178f) * AT(5, 7) + F(-0.375330f) * AT(7, 7));
      const Temp_Type X130 = AT(6, 0);
      const Temp_Type X131 = AT(6, 1);
      const Temp_Type X132 = AT(6, 2);
      const Temp_Type X133 = AT(6, 3);
      const Temp_Type X134 = AT(6, 4);
      const Temp_Type X135 = AT(6, 5);
      const Temp_Type X136 = AT(6, 6);
      const Temp_Type X137 = AT(6, 7);
      // 80 muls 48 adds

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      R.at(0, 0) = X100;
      R.at(0, 1) = D(X101 * F(0.415735f) + X103 * F(0.791065f) + X105 * F(-0.352443f) + X107 * F(0.277785f));
      R.at(0, 2) = X104;
      R.at(0, 3) = D(X101 * F(0.022887f) + X103 * F(-0.097545f) + X105 * F(0.490393f) + X107 * F(0.865723f));
      R.at(1, 0) = X110;
      R.at(1, 1) = D(X111 * F(0.415735f) + X113 * F(0.791065f) + X115 * F(-0.352443f) + X117 * F(0.277785f));
      R.at(1, 2) = X114;
      R.at(1, 3) = D(X111 * F(0.022887f) + X113 * F(-0.097545f) + X115 * F(0.490393f) + X117 * F(0.865723f));
      R.at(2, 0) = X120;
      R.at(2, 1) = D(X121 * F(0.415735f) + X123 * F(0.791065f) + X125 * F(-0.352443f) + X127 * F(0.277785f));
      R.at(2, 2) = X124;
      R.at(2, 3) = D(X121 * F(0.022887f) + X123 * F(-0.097545f) + X125 * F(0.490393f) + X127 * F(0.865723f));
      R.at(3, 0) = X130;
      R.at(3, 1) = D(X131 * F(0.415735f) + X133 * F(0.791065f) + X135 * F(-0.352443f) + X137 * F(0.277785f));
      R.at(3, 2) = X134;
      R.at(3, 3) = D(X131 * F(0.022887f) + X133 * F(-0.097545f) + X135 * F(0.490393f) + X137 * F(0.865723f));
      // 40 muls 24 adds
      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      S.at(0, 0) = D(X101 * F(0.906127f) + X103 * F(-0.318190f) + X105 * F(0.212608f) + X107 * F(-0.180240f));
      S.at(0, 1) = X102;
      S.at(0, 2) = D(X101 * F(-0.074658f) + X103 * F(0.513280f) + X105 * F(0.768178f) + X107 * F(-0.375330f));
      S.at(0, 3) = X106;
      S.at(1, 0) = D(X111 * F(0.906127f) + X113 * F(-0.318190f) + X115 * F(0.212608f) + X117 * F(-0.180240f));
      S.at(1, 1) = X112;
      S.at(1, 2) = D(X111 * F(-0.074658f) + X113 * F(0.513280f) + X115 * F(0.768178f) + X117 * F(-0.375330f));
      S.at(1, 3) = X116;
      S.at(2, 0) = D(X121 * F(0.906127f) + X123 * F(-0.318190f) + X125 * F(0.212608f) + X127 * F(-0.180240f));
      S.at(2, 1) = X122;
      S.at(2, 2) = D(X121 * F(-0.074658f) + X123 * F(0.513280f) + X125 * F(0.768178f) + X127 * F(-0.375330f));
      S.at(2, 3) = X126;
      S.at(3, 0) = D(X131 * F(0.906127f) + X133 * F(-0.318190f) + X135 * F(0.212608f) + X137 * F(-0.180240f));
      S.at(3, 1) = X132;
      S.at(3, 2) = D(X131 * F(-0.074658f) + X133 * F(0.513280f) + X135 * F(0.768178f) + X137 * F(-0.375330f));
      S.at(3, 3) = X136;
      // 40 muls 24 adds
    }